

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::bell_filter(float t)

{
  undefined4 local_10;
  undefined4 local_c;
  float t_local;
  
  local_10 = t;
  if (t < 0.0) {
    local_10 = -t;
  }
  if (0.5 <= local_10) {
    if (1.5 <= local_10) {
      local_c = 0.0;
    }
    else {
      local_c = (local_10 - 1.5) * (local_10 - 1.5) * 0.5;
    }
  }
  else {
    local_c = -local_10 * local_10 + 0.75;
  }
  return local_c;
}

Assistant:

static float bell_filter(float t) /* box (*) box (*) box */
    {
        if (t < 0.0f)
        {
            t = -t;
        }

        if (t < .5f)
        {
            return (.75f - (t * t));
        }

        if (t < 1.5f)
        {
            t = (t - 1.5f);
            return (.5f * (t * t));
        }

        return 0.0f;
    }